

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O3

vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *
tinyusdz::lerp<tinyusdz::value::texcoord3f>
          (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *a,
          vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *b,
          double t)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer ptVar5;
  pointer ptVar6;
  ulong uVar7;
  long lVar8;
  ulong __new_size;
  float fVar9;
  float fVar10;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = ((long)(a->
                 super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(a->
                 super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  __new_size = ((long)(b->
                      super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(b->
                      super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  if (uVar7 <= __new_size) {
    __new_size = uVar7;
  }
  if (__new_size != 0) {
    ::std::vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::resize
              (__return_storage_ptr__,__new_size);
    if ((long)(a->
              super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
              )._M_impl.super__Vector_impl_data._M_start ==
        (long)(b->
              super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(b->
              super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      fVar9 = (float)(1.0 - t);
      fVar10 = (float)t;
      lVar8 = 8;
      do {
        ptVar5 = (a->
                 super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        ptVar6 = (b->
                 super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        fVar1 = *(float *)((long)&ptVar6->s + lVar8);
        fVar2 = *(float *)((long)&ptVar5->s + lVar8);
        uVar3 = *(undefined8 *)((long)ptVar5 + lVar8 + -8);
        uVar4 = *(undefined8 *)((long)ptVar6 + lVar8 + -8);
        ptVar5 = (__return_storage_ptr__->
                 super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)ptVar5 + lVar8 + -8) =
             CONCAT44((float)((ulong)uVar4 >> 0x20) * fVar10 + (float)((ulong)uVar3 >> 0x20) * fVar9
                      ,(float)uVar4 * fVar10 + (float)uVar3 * fVar9);
        *(float *)((long)&ptVar5->s + lVar8) = fVar1 * fVar10 + fVar2 * fVar9;
        lVar8 = lVar8 + 0xc;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}